

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O0

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  *pvVar1;
  pointer *__s;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  uint uVar9;
  size_type sVar10;
  const_reference pvVar11;
  ulong uVar12;
  reference this_00;
  ostream *poVar13;
  undefined8 uVar14;
  cmsysProcess *cp_00;
  reference this_01;
  char **command;
  char *pcVar15;
  string local_780;
  char *local_760;
  char local_758 [8];
  char buf_1 [16];
  int iStack_738;
  int exitCode;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  char buf [16];
  undefined1 local_700 [4];
  int v;
  vector<char,_std::allocator<char>_> local_6e8;
  string local_6d0;
  string local_6b0;
  undefined1 local_690 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_668;
  int p;
  char *data;
  undefined1 local_658 [4];
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  bool merge_output;
  vector<const_char_*,_std::allocator<const_char_*>_> *cmd_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  *__range1_1;
  cmsysProcess *cp;
  string local_5f0;
  double local_5d0;
  double timeout;
  allocator<char> local_5b9;
  string local_5b8;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_598;
  vector<const_char_*,_std::allocator<const_char_*>_> *cmd;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  *__range1;
  string local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  undefined1 local_530 [8];
  string e_1;
  undefined1 local_4f0 [8];
  ostringstream e;
  value_type local_378;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  undefined4 local_208;
  allocator<char> local_201;
  string local_200;
  ulong local_1e0;
  size_t i;
  string local_1d0 [4];
  Encoding encoding;
  string working_directory;
  string results_variable;
  string result_variable;
  string error_variable;
  string output_variable;
  string error_file;
  string output_file;
  string input_file;
  string timeout_string;
  bool error_strip_trailing_whitespace;
  bool output_strip_trailing_whitespace;
  bool error_quiet;
  size_type sStack_a8;
  bool output_quiet;
  size_t command_index;
  string local_98 [7];
  bool doing_command;
  string arguments;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  cmds;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmExecuteProcessCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_003be352;
  }
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            *)((long)&arguments.field_2 + 8));
  std::__cxx11::string::string(local_98);
  bVar5 = false;
  sStack_a8 = 0;
  bVar3 = false;
  bVar4 = false;
  timeout_string.field_2._M_local_buf[0xd] = '\0';
  timeout_string.field_2._M_local_buf[0xc] = '\0';
  std::__cxx11::string::string((string *)(input_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(output_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(error_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(output_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(error_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(result_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(results_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(working_directory.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1d0);
  i._4_4_ = None;
  for (local_1e0 = 0; uVar12 = local_1e0,
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local), uVar12 < sVar10; local_1e0 = local_1e0 + 1) {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local,local_1e0);
    bVar6 = std::operator==(pvVar11,"COMMAND");
    if (bVar6) {
      bVar5 = true;
      pvVar1 = (vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                *)((long)&arguments.field_2 + 8);
      sStack_a8 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ::size(pvVar1);
      std::
      vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ::emplace_back<>(pvVar1);
    }
    else {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local,local_1e0);
      bVar6 = std::operator==(pvVar11,"OUTPUT_VARIABLE");
      if (bVar6) {
        bVar5 = false;
        uVar12 = local_1e0 + 1;
        local_1e0 = uVar12;
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local);
        if (sVar10 <= uVar12) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200," called with no value for OUTPUT_VARIABLE.",&local_201);
          cmCommand::SetError(&this->super_cmCommand,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator(&local_201);
          this_local._7_1_ = 0;
          local_208 = 1;
          goto LAB_003be249;
        }
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local,local_1e0);
        std::__cxx11::string::operator=
                  ((string *)(error_variable.field_2._M_local_buf + 8),(string *)pvVar11);
      }
      else {
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local,local_1e0);
        bVar6 = std::operator==(pvVar11,"ERROR_VARIABLE");
        if (bVar6) {
          bVar5 = false;
          uVar12 = local_1e0 + 1;
          local_1e0 = uVar12;
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local);
          if (sVar10 <= uVar12) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228," called with no value for ERROR_VARIABLE.",&local_229);
            cmCommand::SetError(&this->super_cmCommand,&local_228);
            std::__cxx11::string::~string((string *)&local_228);
            std::allocator<char>::~allocator(&local_229);
            this_local._7_1_ = 0;
            local_208 = 1;
            goto LAB_003be249;
          }
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)param_2_local,local_1e0);
          std::__cxx11::string::operator=
                    ((string *)(result_variable.field_2._M_local_buf + 8),(string *)pvVar11);
        }
        else {
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)param_2_local,local_1e0);
          bVar6 = std::operator==(pvVar11,"RESULT_VARIABLE");
          if (bVar6) {
            bVar5 = false;
            uVar12 = local_1e0 + 1;
            local_1e0 = uVar12;
            sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local);
            if (sVar10 <= uVar12) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_250," called with no value for RESULT_VARIABLE.",
                         &local_251);
              cmCommand::SetError(&this->super_cmCommand,&local_250);
              std::__cxx11::string::~string((string *)&local_250);
              std::allocator<char>::~allocator(&local_251);
              this_local._7_1_ = 0;
              local_208 = 1;
              goto LAB_003be249;
            }
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)param_2_local,local_1e0);
            std::__cxx11::string::operator=
                      ((string *)(results_variable.field_2._M_local_buf + 8),(string *)pvVar11);
          }
          else {
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)param_2_local,local_1e0);
            bVar6 = std::operator==(pvVar11,"RESULTS_VARIABLE");
            if (bVar6) {
              bVar5 = false;
              uVar12 = local_1e0 + 1;
              local_1e0 = uVar12;
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local);
              if (sVar10 <= uVar12) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278," called with no value for RESULTS_VARIABLE.",
                           &local_279);
                cmCommand::SetError(&this->super_cmCommand,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::allocator<char>::~allocator(&local_279);
                this_local._7_1_ = 0;
                local_208 = 1;
                goto LAB_003be249;
              }
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)param_2_local,local_1e0);
              std::__cxx11::string::operator=
                        ((string *)(working_directory.field_2._M_local_buf + 8),(string *)pvVar11);
            }
            else {
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)param_2_local,local_1e0);
              bVar6 = std::operator==(pvVar11,"WORKING_DIRECTORY");
              if (bVar6) {
                bVar5 = false;
                uVar12 = local_1e0 + 1;
                local_1e0 = uVar12;
                sVar10 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local);
                if (sVar10 <= uVar12) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2a0," called with no value for WORKING_DIRECTORY.",
                             &local_2a1);
                  cmCommand::SetError(&this->super_cmCommand,&local_2a0);
                  std::__cxx11::string::~string((string *)&local_2a0);
                  std::allocator<char>::~allocator(&local_2a1);
                  this_local._7_1_ = 0;
                  local_208 = 1;
                  goto LAB_003be249;
                }
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)param_2_local,local_1e0);
                std::__cxx11::string::operator=(local_1d0,(string *)pvVar11);
              }
              else {
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)param_2_local,local_1e0);
                bVar6 = std::operator==(pvVar11,"INPUT_FILE");
                if (bVar6) {
                  bVar5 = false;
                  uVar12 = local_1e0 + 1;
                  local_1e0 = uVar12;
                  sVar10 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local);
                  if (sVar10 <= uVar12) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2c8," called with no value for INPUT_FILE.",
                               &local_2c9);
                    cmCommand::SetError(&this->super_cmCommand,&local_2c8);
                    std::__cxx11::string::~string((string *)&local_2c8);
                    std::allocator<char>::~allocator(&local_2c9);
                    this_local._7_1_ = 0;
                    local_208 = 1;
                    goto LAB_003be249;
                  }
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)param_2_local,local_1e0);
                  std::__cxx11::string::operator=
                            ((string *)(output_file.field_2._M_local_buf + 8),(string *)pvVar11);
                }
                else {
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)param_2_local,local_1e0);
                  bVar6 = std::operator==(pvVar11,"OUTPUT_FILE");
                  if (bVar6) {
                    bVar5 = false;
                    uVar12 = local_1e0 + 1;
                    local_1e0 = uVar12;
                    sVar10 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local);
                    if (sVar10 <= uVar12) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2f0," called with no value for OUTPUT_FILE.",
                                 &local_2f1);
                      cmCommand::SetError(&this->super_cmCommand,&local_2f0);
                      std::__cxx11::string::~string((string *)&local_2f0);
                      std::allocator<char>::~allocator(&local_2f1);
                      this_local._7_1_ = 0;
                      local_208 = 1;
                      goto LAB_003be249;
                    }
                    pvVar11 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)param_2_local,local_1e0);
                    std::__cxx11::string::operator=
                              ((string *)(error_file.field_2._M_local_buf + 8),(string *)pvVar11);
                  }
                  else {
                    pvVar11 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)param_2_local,local_1e0);
                    bVar6 = std::operator==(pvVar11,"ERROR_FILE");
                    if (bVar6) {
                      bVar5 = false;
                      uVar12 = local_1e0 + 1;
                      local_1e0 = uVar12;
                      sVar10 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local);
                      if (sVar10 <= uVar12) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_318," called with no value for ERROR_FILE.",
                                   &local_319);
                        cmCommand::SetError(&this->super_cmCommand,&local_318);
                        std::__cxx11::string::~string((string *)&local_318);
                        std::allocator<char>::~allocator(&local_319);
                        this_local._7_1_ = 0;
                        local_208 = 1;
                        goto LAB_003be249;
                      }
                      pvVar11 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)param_2_local,local_1e0);
                      std::__cxx11::string::operator=
                                ((string *)(output_variable.field_2._M_local_buf + 8),
                                 (string *)pvVar11);
                    }
                    else {
                      pvVar11 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)param_2_local,local_1e0);
                      bVar6 = std::operator==(pvVar11,"TIMEOUT");
                      if (bVar6) {
                        bVar5 = false;
                        uVar12 = local_1e0 + 1;
                        local_1e0 = uVar12;
                        sVar10 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local);
                        if (sVar10 <= uVar12) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_340," called with no value for TIMEOUT.",
                                     &local_341);
                          cmCommand::SetError(&this->super_cmCommand,&local_340);
                          std::__cxx11::string::~string((string *)&local_340);
                          std::allocator<char>::~allocator(&local_341);
                          this_local._7_1_ = 0;
                          local_208 = 1;
                          goto LAB_003be249;
                        }
                        pvVar11 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)param_2_local,local_1e0);
                        std::__cxx11::string::operator=
                                  ((string *)(input_file.field_2._M_local_buf + 8),(string *)pvVar11
                                  );
                      }
                      else {
                        pvVar11 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)param_2_local,local_1e0);
                        bVar6 = std::operator==(pvVar11,"OUTPUT_QUIET");
                        if (bVar6) {
                          bVar5 = false;
                          bVar3 = true;
                        }
                        else {
                          pvVar11 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1e0);
                          bVar6 = std::operator==(pvVar11,"ERROR_QUIET");
                          if (bVar6) {
                            bVar5 = false;
                            bVar4 = true;
                          }
                          else {
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1e0);
                            bVar6 = std::operator==(pvVar11,"OUTPUT_STRIP_TRAILING_WHITESPACE");
                            if (bVar6) {
                              bVar5 = false;
                              timeout_string.field_2._M_local_buf[0xd] = '\x01';
                            }
                            else {
                              pvVar11 = std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1e0);
                              bVar6 = std::operator==(pvVar11,"ERROR_STRIP_TRAILING_WHITESPACE");
                              if (bVar6) {
                                bVar5 = false;
                                timeout_string.field_2._M_local_buf[0xc] = '\x01';
                              }
                              else {
                                pvVar11 = std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1e0);
                                bVar6 = std::operator==(pvVar11,"ENCODING");
                                if (bVar6) {
                                  bVar5 = false;
                                  uVar12 = local_1e0 + 1;
                                  local_1e0 = uVar12;
                                  sVar10 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::size((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                  if (sVar10 <= uVar12) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_368,
                                               " called with no value for ENCODING.",&local_369);
                                    cmCommand::SetError(&this->super_cmCommand,&local_368);
                                    std::__cxx11::string::~string((string *)&local_368);
                                    std::allocator<char>::~allocator(&local_369);
                                    this_local._7_1_ = 0;
                                    local_208 = 1;
                                    goto LAB_003be249;
                                  }
                                  pvVar11 = std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1e0);
                                  i._4_4_ = cmProcessOutput::FindEncoding(pvVar11);
                                }
                                else {
                                  if (!bVar5) {
                                    std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_4f0);
                                    poVar13 = std::operator<<((ostream *)local_4f0,
                                                              " given unknown argument \"");
                                    pvVar11 = std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1e0);
                                    poVar13 = std::operator<<(poVar13,(string *)pvVar11);
                                    std::operator<<(poVar13,"\".");
                                    std::__cxx11::ostringstream::str();
                                    cmCommand::SetError(&this->super_cmCommand,
                                                        (string *)((long)&e_1.field_2 + 8));
                                    std::__cxx11::string::~string
                                              ((string *)(e_1.field_2._M_local_buf + 8));
                                    this_local._7_1_ = 0;
                                    local_208 = 1;
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_4f0);
                                    goto LAB_003be249;
                                  }
                                  this_00 = std::
                                            vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                            ::operator[]((
                                                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                                  *)((long)&arguments.field_2 + 8),sStack_a8);
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)param_2_local,local_1e0);
                                  local_378 = (value_type)std::__cxx11::string::c_str();
                                  std::vector<const_char_*,_std::allocator<const_char_*>_>::
                                  push_back(this_00,&local_378);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar5 = cmMakefile::CanIWriteThisFile
                    ((this->super_cmCommand).Makefile,(string *)((long)&error_file.field_2 + 8));
  if (bVar5) {
    bVar5 = std::
            vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ::empty((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     *)((long)&arguments.field_2 + 8));
    if (bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_570," called with no COMMAND argument.",
                 (allocator<char> *)((long)&__range1 + 7));
      cmCommand::SetError(&this->super_cmCommand,&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      this_local._7_1_ = 0;
      local_208 = 1;
    }
    else {
      pvVar1 = (vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                *)((long)&arguments.field_2 + 8);
      __end1 = std::
               vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ::begin(pvVar1);
      cmd = (vector<const_char_*,_std::allocator<const_char_*>_> *)
            std::
            vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ::end(pvVar1);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>_>
                                         *)&cmd), bVar5) {
        local_598 = __gnu_cxx::
                    __normal_iterator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>_>
                    ::operator*(&__end1);
        bVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty(local_598);
        if (bVar5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5b8," given COMMAND argument with no value.",&local_5b9);
          cmCommand::SetError(&this->super_cmCommand,&local_5b8);
          std::__cxx11::string::~string((string *)&local_5b8);
          std::allocator<char>::~allocator(&local_5b9);
          this_local._7_1_ = 0;
          local_208 = 1;
          goto LAB_003be249;
        }
        timeout = 0.0;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (local_598,(value_type *)&timeout);
        __gnu_cxx::
        __normal_iterator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>_>
        ::operator++(&__end1);
      }
      local_5d0 = -1.0;
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        uVar14 = std::__cxx11::string::c_str();
        iVar8 = __isoc99_sscanf(uVar14,"%lg",&local_5d0);
        if (iVar8 != 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5f0," called with TIMEOUT value that could not be parsed.",
                     (allocator<char> *)((long)&cp + 7));
          cmCommand::SetError(&this->super_cmCommand,&local_5f0);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&cp + 7));
          this_local._7_1_ = 0;
          local_208 = 1;
          goto LAB_003be249;
        }
      }
      cp_00 = cmsysProcess_New();
      pvVar1 = (vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                *)((long)&arguments.field_2 + 8);
      __end1_1 = std::
                 vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ::begin(pvVar1);
      cmd_1 = (vector<const_char_*,_std::allocator<const_char_*>_> *)
              std::
              vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ::end(pvVar1);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>_>
                                 *)&cmd_1), bVar5) {
        this_01 = __gnu_cxx::
                  __normal_iterator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>_>
                  ::operator*(&__end1_1);
        command = std::vector<const_char_*,_std::allocator<const_char_*>_>::data(this_01);
        cmsysProcess_AddCommand(cp_00,command);
        __gnu_cxx::
        __normal_iterator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>_>
        ::operator++(&__end1_1);
      }
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        pcVar15 = (char *)std::__cxx11::string::c_str();
        cmsysProcess_SetWorkingDirectory(cp_00,pcVar15);
      }
      cmsysProcess_SetOption(cp_00,0,1);
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        pcVar15 = (char *)std::__cxx11::string::c_str();
        cmsysProcess_SetPipeFile(cp_00,1,pcVar15);
      }
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        pcVar15 = (char *)std::__cxx11::string::c_str();
        cmsysProcess_SetPipeFile(cp_00,2,pcVar15);
      }
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) == 0) &&
         (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&output_variable.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&error_file.field_2 + 8)),
         !(bool)tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_)) {
        pcVar15 = (char *)std::__cxx11::string::c_str();
        cmsysProcess_SetPipeFile(cp_00,3,pcVar15);
      }
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) == 0) &&
         (_Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&error_variable.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&result_variable.field_2 + 8)), _Var7)) {
        tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
      }
      if (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ != '\0') {
        cmsysProcess_SetOption(cp_00,2,1);
      }
      if (0.0 <= local_5d0) {
        cmsysProcess_SetTimeout(cp_00,local_5d0);
      }
      cmsysProcess_Execute(cp_00);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_658);
      cmProcessOutput::cmProcessOutput
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),i._4_4_,0x400);
      std::__cxx11::string::string((string *)local_690);
      while (strdata.field_2._12_4_ =
                  cmsysProcess_WaitForData
                            (cp_00,&stack0xfffffffffffff998,(int *)((long)&data + 4),(double *)0x0),
            strdata.field_2._12_4_ != 0) {
        if ((strdata.field_2._12_4_ != 2) || (bVar3)) {
          if ((strdata.field_2._12_4_ == 3) && (!bVar4)) {
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              cmExecuteProcessCommandAppend
                        ((vector<char,_std::allocator<char>_> *)local_658,pcStack_668,data._4_4_);
            }
            else {
              cmProcessOutput::DecodeText
                        ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_668,
                         (long)data._4_4_,(string *)local_690,2);
              cmSystemTools::Stderr((string *)local_690);
            }
          }
        }
        else {
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) == 0) {
            cmExecuteProcessCommandAppend
                      ((vector<char,_std::allocator<char>_> *)
                       &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                       ,pcStack_668,data._4_4_);
          }
          else {
            cmProcessOutput::DecodeText
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_668,
                       (long)data._4_4_,(string *)local_690,1);
            cmSystemTools::Stdout((string *)local_690);
          }
        }
      }
      if ((!bVar3) && (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
        std::__cxx11::string::string((string *)&local_6b0);
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_6b0,
                   (string *)local_690,1);
        std::__cxx11::string::~string((string *)&local_6b0);
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) == 0) {
          cmSystemTools::Stdout((string *)local_690);
        }
      }
      if ((!bVar4) && (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
        std::__cxx11::string::string((string *)&local_6d0);
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_6d0,
                   (string *)local_690,2);
        std::__cxx11::string::~string((string *)&local_6d0);
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) == 0) {
          cmSystemTools::Stderr((string *)local_690);
        }
      }
      cmsysProcess_WaitForExit(cp_00,(double *)0x0);
      std::vector<char,_std::allocator<char>_>::vector
                (&local_6e8,
                 (vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_6e8,
                 (vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0);
      std::vector<char,_std::allocator<char>_>::~vector(&local_6e8);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_700,
                 (vector<char,_std::allocator<char>_> *)local_658);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),
                 (vector<char,_std::allocator<char>_> *)local_700,
                 (vector<char,_std::allocator<char>_> *)local_658,0);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_700);
      cmExecuteProcessCommandFixText
                ((vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 (bool)timeout_string.field_2._M_local_buf[0xd]);
      cmExecuteProcessCommandFixText
                ((vector<char,_std::allocator<char>_> *)local_658,
                 (bool)timeout_string.field_2._M_local_buf[0xc]);
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) == 0) &&
         (bVar5 = std::vector<char,_std::allocator<char>_>::empty
                            ((vector<char,_std::allocator<char>_> *)
                             &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10), !bVar5)) {
        pcVar2 = (this->super_cmCommand).Makefile;
        pcVar15 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)
                             &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10);
        cmMakefile::AddDefinition(pcVar2,(string *)((long)&error_variable.field_2 + 8),pcVar15);
      }
      if (((tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ == '\0') &&
          (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) == 0)) &&
         (bVar5 = std::vector<char,_std::allocator<char>_>::empty
                            ((vector<char,_std::allocator<char>_> *)local_658), !bVar5)) {
        pcVar2 = (this->super_cmCommand).Makefile;
        pcVar15 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)local_658);
        cmMakefile::AddDefinition(pcVar2,(string *)((long)&result_variable.field_2 + 8),pcVar15);
      }
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        iVar8 = cmsysProcess_GetState(cp_00);
        switch(iVar8) {
        case 1:
          pcVar2 = (this->super_cmCommand).Makefile;
          pcVar15 = cmsysProcess_GetErrorString(cp_00);
          cmMakefile::AddDefinition(pcVar2,(string *)((long)&results_variable.field_2 + 8),pcVar15);
          break;
        case 2:
          pcVar2 = (this->super_cmCommand).Makefile;
          pcVar15 = cmsysProcess_GetExceptionString(cp_00);
          cmMakefile::AddDefinition(pcVar2,(string *)((long)&results_variable.field_2 + 8),pcVar15);
          break;
        case 4:
          uVar9 = cmsysProcess_GetExitValue(cp_00);
          __s = &res.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
          sprintf((char *)__s,"%d",(ulong)uVar9);
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,
                     (string *)((long)&results_variable.field_2 + 8),(char *)__s);
          break;
        case 5:
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,
                     (string *)((long)&results_variable.field_2 + 8),
                     "Process terminated due to timeout");
        }
      }
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        iVar8 = cmsysProcess_GetState(cp_00);
        switch(iVar8) {
        case 1:
          pcVar2 = (this->super_cmCommand).Makefile;
          pcVar15 = cmsysProcess_GetErrorString(cp_00);
          cmMakefile::AddDefinition(pcVar2,(string *)((long)&working_directory.field_2 + 8),pcVar15)
          ;
          break;
        case 2:
          pcVar2 = (this->super_cmCommand).Makefile;
          pcVar15 = cmsysProcess_GetExceptionString(cp_00);
          cmMakefile::AddDefinition(pcVar2,(string *)((long)&working_directory.field_2 + 8),pcVar15)
          ;
          break;
        case 4:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i_1);
          for (_iStack_738 = 0;
              sVar10 = std::
                       vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                       ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                               *)((long)&arguments.field_2 + 8)), _iStack_738 < sVar10;
              _iStack_738 = _iStack_738 + 1) {
            iVar8 = cmsysProcess_GetStateByIndex(cp_00,iStack_738);
            if (iVar8 == 1) {
LAB_003be050:
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[36]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i_1,
                         (char (*) [36])"Error getting the child return code");
            }
            else if (iVar8 == 2) {
              local_760 = cmsysProcess_GetExceptionStringByIndex(cp_00,iStack_738);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i_1,
                         &local_760);
            }
            else {
              if (iVar8 != 4) goto LAB_003be050;
              uVar9 = cmsysProcess_GetExitValueByIndex(cp_00,iStack_738);
              sprintf(local_758,"%d",(ulong)uVar9);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char(&)[16]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i_1,
                         (char (*) [16])local_758);
            }
          }
          pcVar2 = (this->super_cmCommand).Makefile;
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&local_780,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i_1,";");
          pcVar15 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(pcVar2,(string *)((long)&working_directory.field_2 + 8),pcVar15)
          ;
          std::__cxx11::string::~string((string *)&local_780);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i_1);
          break;
        case 5:
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,
                     (string *)((long)&working_directory.field_2 + 8),
                     "Process terminated due to timeout");
        }
      }
      cmsysProcess_Delete(cp_00);
      this_local._7_1_ = 1;
      local_208 = 1;
      std::__cxx11::string::~string((string *)local_690);
      cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb));
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_658);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    }
  }
  else {
    std::operator+(&local_550,"attempted to output into a file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&error_file.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530,
                   &local_550," into a source directory.");
    std::__cxx11::string::~string((string *)&local_550);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_530);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = 0;
    local_208 = 1;
    std::__cxx11::string::~string((string *)local_530);
  }
LAB_003be249:
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string((string *)(working_directory.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(results_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(result_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(error_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(error_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(input_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_98);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
             *)((long)&arguments.field_2 + 8));
LAB_003be352:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExecuteProcessCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::vector<const char*>> cmds;
  std::string arguments;
  bool doing_command = false;
  size_t command_index = 0;
  bool output_quiet = false;
  bool error_quiet = false;
  bool output_strip_trailing_whitespace = false;
  bool error_strip_trailing_whitespace = false;
  std::string timeout_string;
  std::string input_file;
  std::string output_file;
  std::string error_file;
  std::string output_variable;
  std::string error_variable;
  std::string result_variable;
  std::string results_variable;
  std::string working_directory;
  cmProcessOutput::Encoding encoding = cmProcessOutput::None;
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMMAND") {
      doing_command = true;
      command_index = cmds.size();
      cmds.emplace_back();
    } else if (args[i] == "OUTPUT_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        output_variable = args[i];
      } else {
        this->SetError(" called with no value for OUTPUT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "ERROR_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        error_variable = args[i];
      } else {
        this->SetError(" called with no value for ERROR_VARIABLE.");
        return false;
      }
    } else if (args[i] == "RESULT_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        result_variable = args[i];
      } else {
        this->SetError(" called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "RESULTS_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        results_variable = args[i];
      } else {
        this->SetError(" called with no value for RESULTS_VARIABLE.");
        return false;
      }
    } else if (args[i] == "WORKING_DIRECTORY") {
      doing_command = false;
      if (++i < args.size()) {
        working_directory = args[i];
      } else {
        this->SetError(" called with no value for WORKING_DIRECTORY.");
        return false;
      }
    } else if (args[i] == "INPUT_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        input_file = args[i];
      } else {
        this->SetError(" called with no value for INPUT_FILE.");
        return false;
      }
    } else if (args[i] == "OUTPUT_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        output_file = args[i];
      } else {
        this->SetError(" called with no value for OUTPUT_FILE.");
        return false;
      }
    } else if (args[i] == "ERROR_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        error_file = args[i];
      } else {
        this->SetError(" called with no value for ERROR_FILE.");
        return false;
      }
    } else if (args[i] == "TIMEOUT") {
      doing_command = false;
      if (++i < args.size()) {
        timeout_string = args[i];
      } else {
        this->SetError(" called with no value for TIMEOUT.");
        return false;
      }
    } else if (args[i] == "OUTPUT_QUIET") {
      doing_command = false;
      output_quiet = true;
    } else if (args[i] == "ERROR_QUIET") {
      doing_command = false;
      error_quiet = true;
    } else if (args[i] == "OUTPUT_STRIP_TRAILING_WHITESPACE") {
      doing_command = false;
      output_strip_trailing_whitespace = true;
    } else if (args[i] == "ERROR_STRIP_TRAILING_WHITESPACE") {
      doing_command = false;
      error_strip_trailing_whitespace = true;
    } else if (args[i] == "ENCODING") {
      doing_command = false;
      if (++i < args.size()) {
        encoding = cmProcessOutput::FindEncoding(args[i]);
      } else {
        this->SetError(" called with no value for ENCODING.");
        return false;
      }
    } else if (doing_command) {
      cmds[command_index].push_back(args[i].c_str());
    } else {
      std::ostringstream e;
      e << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  if (!this->Makefile->CanIWriteThisFile(output_file)) {
    std::string e = "attempted to output into a file: " + output_file +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Check for commands given.
  if (cmds.empty()) {
    this->SetError(" called with no COMMAND argument.");
    return false;
  }
  for (auto& cmd : cmds) {
    if (cmd.empty()) {
      this->SetError(" given COMMAND argument with no value.");
      return false;
    }
    // Add the null terminating pointer to the command argument list.
    cmd.push_back(nullptr);
  }

  // Parse the timeout string.
  double timeout = -1;
  if (!timeout_string.empty()) {
    if (sscanf(timeout_string.c_str(), "%lg", &timeout) != 1) {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
    }
  }

  // Create a process instance.
  cmsysProcess* cp = cmsysProcess_New();

  // Set the command sequence.
  for (auto const& cmd : cmds) {
    cmsysProcess_AddCommand(cp, cmd.data());
  }

  // Set the process working directory.
  if (!working_directory.empty()) {
    cmsysProcess_SetWorkingDirectory(cp, working_directory.c_str());
  }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if (!input_file.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN, input_file.c_str());
  }
  if (!output_file.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             output_file.c_str());
  }
  if (!error_file.empty()) {
    if (error_file == output_file) {
      merge_output = true;
    } else {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               error_file.c_str());
    }
  }
  if (!output_variable.empty() && output_variable == error_variable) {
    merge_output = true;
  }
  if (merge_output) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
  }

  // Set the timeout if any.
  if (timeout >= 0) {
    cmsysProcess_SetTimeout(cp, timeout);
  }

  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !output_quiet) {
      if (output_variable.empty()) {
        processOutput.DecodeText(data, length, strdata, 1);
        cmSystemTools::Stdout(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
      }
    } else if (p == cmsysProcess_Pipe_STDERR && !error_quiet) {
      if (error_variable.empty()) {
        processOutput.DecodeText(data, length, strdata, 2);
        cmSystemTools::Stderr(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempError, data, length);
      }
    }
  }
  if (!output_quiet && output_variable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }
  if (!error_quiet && error_variable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      cmSystemTools::Stderr(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  processOutput.DecodeText(tempError, tempError);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput, output_strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(tempError, error_strip_trailing_whitespace);

  // Store the output obtained.
  if (!output_variable.empty() && !tempOutput.empty()) {
    this->Makefile->AddDefinition(output_variable, tempOutput.data());
  }
  if (!merge_output && !error_variable.empty() && !tempError.empty()) {
    this->Makefile->AddDefinition(error_variable, tempError.data());
  }

  // Store the result of running the process.
  if (!result_variable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[16];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(result_variable, buf);
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(result_variable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(result_variable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(result_variable,
                                      "Process terminated due to timeout");
        break;
    }
  }
  // Store the result of running the processes.
  if (!results_variable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        std::vector<std::string> res;
        for (size_t i = 0; i < cmds.size(); ++i) {
          switch (cmsysProcess_GetStateByIndex(cp, static_cast<int>(i))) {
            case kwsysProcess_StateByIndex_Exited: {
              int exitCode =
                cmsysProcess_GetExitValueByIndex(cp, static_cast<int>(i));
              char buf[16];
              sprintf(buf, "%d", exitCode);
              res.emplace_back(buf);
            } break;
            case kwsysProcess_StateByIndex_Exception:
              res.emplace_back(cmsysProcess_GetExceptionStringByIndex(
                cp, static_cast<int>(i)));
              break;
            case kwsysProcess_StateByIndex_Error:
            default:
              res.emplace_back("Error getting the child return code");
              break;
          }
        }
        this->Makefile->AddDefinition(results_variable,
                                      cmJoin(res, ";").c_str());
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(results_variable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(results_variable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(results_variable,
                                      "Process terminated due to timeout");
        break;
    }
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}